

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O0

FT_Error T1_Load_Glyph(FT_GlyphSlot t1glyph,FT_Size t1size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Face pFVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  FT_Int32 FVar5;
  FT_Int32 FVar6;
  FT_Fixed FVar7;
  FT_Int32 b;
  bool local_cb9;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_Vector *vec;
  FT_Outline *cur;
  FT_Int n;
  FT_Glyph_Metrics *metrics;
  FT_BBox cbox;
  FT_Slot_Internal internal;
  undefined1 auStack_c58 [6];
  FT_Bool glyph_data_loaded;
  FT_Bool must_finish_decoder;
  FT_Data glyph_data;
  FT_Vector font_offset;
  FT_Matrix font_matrix;
  T1_Decoder_Funcs decoder_funcs;
  PSAux_Service psaux;
  T1_Font type1;
  FT_Bool force_scaling;
  FT_Bool scaled;
  FT_Face pFStack_bf8;
  FT_Bool hinting;
  T1_Face face;
  T1_DecoderRec decoder;
  FT_Error error;
  T1_GlyphSlot glyph;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size t1size_local;
  FT_GlyphSlot t1glyph_local;
  
  pFVar1 = t1glyph->face;
  type1._5_1_ = '\0';
  puVar2 = *(undefined8 **)(pFVar1[3].family_name + 0x18);
  bVar4 = false;
  bVar3 = false;
  pFStack_bf8 = pFVar1;
  if ((glyph_index < (uint)pFVar1->num_glyphs) ||
     (pFVar1->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) {
    glyph._0_4_ = load_flags;
    if ((load_flags & 0x400U) != 0) {
      glyph._0_4_ = load_flags | 3;
    }
    if (t1size == (FT_Size)0x0) {
      t1glyph[1].face = (FT_Face)0x10000;
      t1glyph[1].next = (FT_GlyphSlot)0x10000;
    }
    else {
      t1glyph[1].face = (FT_Face)(t1size->metrics).x_scale;
      t1glyph[1].next = (FT_GlyphSlot)(t1size->metrics).y_scale;
    }
    (t1glyph->outline).n_points = 0;
    (t1glyph->outline).n_contours = 0;
    local_cb9 = ((uint)glyph & 1) == 0 && ((uint)glyph & 2) == 0;
    type1._7_1_ = local_cb9;
    type1._6_1_ = ((uint)glyph & 1) == 0;
    *(bool *)&t1glyph[1].library = local_cb9;
    *(undefined1 *)((long)&t1glyph[1].library + 1) = type1._6_1_;
    t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;
    decoder.cf2_instance.finalizer._4_4_ =
         (*(code *)*puVar2)(&face,t1glyph->face,t1size,t1glyph,pFVar1[2].glyph,pFVar1[3].bbox.xMin,
                            local_cb9,(int)(uint)glyph >> 0x10 & 0xf,T1_Parse_Glyph);
    if (decoder.cf2_instance.finalizer._4_4_ == 0) {
      bVar4 = true;
      decoder.builder.bbox.yMax._5_1_ = ((uint)glyph & 0x400) != 0;
      decoder.glyph_names._4_4_ = (undefined4)pFVar1[2].bbox.yMin;
      decoder._2712_8_ = pFVar1[2].bbox.xMax;
      decoder.subrs = (FT_Byte **)pFVar1[2].bbox.yMax;
      decoder.subrs_len = *(FT_UInt **)&pFVar1[2].units_per_EM;
      decoder.funcs.parse_charstrings =
           (_func_FT_Error_PS_Decoder_ptr_FT_Byte_ptr_FT_ULong *)pFStack_bf8[3].bbox.yMax;
      decoder.buildchar._0_4_ = (undefined4)pFStack_bf8[3].bbox.xMax;
      decoder.cf2_instance.finalizer._4_4_ =
           T1_Parse_Glyph_And_Get_Char_String
                     ((T1_Decoder_conflict)&face,glyph_index,(FT_Data *)auStack_c58,
                      (FT_Bool *)((long)&type1 + 5));
      if (decoder.cf2_instance.finalizer._4_4_ == 0) {
        bVar3 = true;
        type1._7_1_ = *(char *)&t1glyph[1].library;
        font_offset.y = (FT_Pos)decoder.subrs_hash;
        glyph_data._8_8_ = decoder.font_matrix.yy;
        font_offset.x = decoder.font_offset.x;
        (*(code *)puVar2[1])(&face);
        bVar4 = false;
        if (decoder.cf2_instance.finalizer._4_4_ == 0) {
          (t1glyph->outline).flags = (t1glyph->outline).flags & 1;
          (t1glyph->outline).flags = (t1glyph->outline).flags | 4;
          if (((uint)glyph & 0x400) == 0) {
            FVar7 = FT_RoundFix(decoder.builder.left_bearing.y);
            (t1glyph->metrics).horiAdvance = FVar7 >> 0x10;
            FVar7 = FT_RoundFix(decoder.builder.left_bearing.y);
            t1glyph->linearHoriAdvance = FVar7 >> 0x10;
            t1glyph->internal->glyph_transformed = '\0';
            if (((uint)glyph & 0x10) == 0) {
              FVar7 = FT_RoundFix(decoder.builder.advance.x);
              (t1glyph->metrics).vertAdvance = FVar7 >> 0x10;
              FVar7 = FT_RoundFix(decoder.builder.advance.x);
              t1glyph->linearVertAdvance = FVar7 >> 0x10;
            }
            else {
              (t1glyph->metrics).vertAdvance =
                   pFStack_bf8[3].face_index - (long)pFStack_bf8[2].internal >> 0x10;
              t1glyph->linearVertAdvance = (t1glyph->metrics).vertAdvance;
            }
            t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;
            if ((t1size != (FT_Size)0x0) && ((t1size->metrics).y_ppem < 0x18)) {
              (t1glyph->outline).flags = (t1glyph->outline).flags | 0x100;
            }
            if ((((font_offset.y != 0x10000) || (decoder.font_matrix.yx != 0x10000)) ||
                (decoder.font_matrix.xx != 0)) || (decoder.font_matrix.xy != 0)) {
              FT_Outline_Transform(&t1glyph->outline,(FT_Matrix *)&font_offset.y);
              FVar5 = FT_MulFix_x86_64((FT_Int32)(t1glyph->metrics).horiAdvance,
                                       (FT_Int32)font_offset.y);
              (t1glyph->metrics).horiAdvance = (long)FVar5;
              FVar5 = FT_MulFix_x86_64((FT_Int32)(t1glyph->metrics).vertAdvance,
                                       (FT_Int32)decoder.font_matrix.yx);
              (t1glyph->metrics).vertAdvance = (long)FVar5;
            }
            if ((glyph_data._8_8_ != 0) || (font_offset.x != 0)) {
              FT_Outline_Translate(&t1glyph->outline,glyph_data._8_8_,font_offset.x);
              (t1glyph->metrics).horiAdvance = glyph_data._8_8_ + (t1glyph->metrics).horiAdvance;
              (t1glyph->metrics).vertAdvance = font_offset.x + (t1glyph->metrics).vertAdvance;
            }
            if ((((uint)glyph & 1) == 0) || (type1._5_1_ != '\0')) {
              x_scale._0_4_ = (decoder.builder.loader)->max_points;
              x_scale._4_4_ = (decoder.builder.loader)->max_contours;
              FVar5 = (FT_Int32)t1glyph[1].face;
              b = (FT_Int32)t1glyph[1].next;
              if ((type1._7_1_ == '\0') || (decoder.builder._128_8_ == 0)) {
                for (cur._4_4_ = (int)*(short *)((long)&(decoder.builder.loader)->memory + 2);
                    0 < cur._4_4_; cur._4_4_ = cur._4_4_ + -1) {
                  FVar6 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)x_scale,FVar5);
                  *(long *)x_scale = (long)FVar6;
                  FVar6 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)(x_scale + 8),b);
                  *(long *)(x_scale + 8) = (long)FVar6;
                  x_scale = x_scale + 0x10;
                }
              }
              FVar5 = FT_MulFix_x86_64((FT_Int32)(t1glyph->metrics).horiAdvance,FVar5);
              (t1glyph->metrics).horiAdvance = (long)FVar5;
              FVar5 = FT_MulFix_x86_64((FT_Int32)(t1glyph->metrics).vertAdvance,b);
              (t1glyph->metrics).vertAdvance = (long)FVar5;
            }
            FT_Outline_Get_CBox(&t1glyph->outline,(FT_BBox *)&metrics);
            (t1glyph->metrics).width = cbox.yMin - (long)metrics;
            (t1glyph->metrics).height = cbox.xMax - cbox.xMin;
            (t1glyph->metrics).horiBearingX = (FT_Pos)metrics;
            (t1glyph->metrics).horiBearingY = cbox.xMax;
            if (((uint)glyph & 0x10) != 0) {
              ft_synthesize_vertical_metrics(&t1glyph->metrics,(t1glyph->metrics).vertAdvance);
            }
          }
          else {
            cbox.yMax = (FT_Pos)t1glyph->internal;
            FVar7 = FT_RoundFix(decoder.builder.pos_y);
            (t1glyph->metrics).horiBearingX = FVar7 >> 0x10;
            FVar7 = FT_RoundFix(decoder.builder.left_bearing.y);
            (t1glyph->metrics).horiAdvance = FVar7 >> 0x10;
            *(FT_Pos *)(cbox.yMax + 0x10) = font_offset.y;
            *(FT_Fixed *)(cbox.yMax + 0x18) = decoder.font_matrix.xx;
            *(FT_Fixed *)(cbox.yMax + 0x20) = decoder.font_matrix.xy;
            *(FT_Fixed *)(cbox.yMax + 0x28) = decoder.font_matrix.yx;
            *(undefined8 *)(cbox.yMax + 0x30) = glyph_data._8_8_;
            *(FT_Pos *)(cbox.yMax + 0x38) = font_offset.x;
            *(undefined1 *)(cbox.yMax + 0xc) = 1;
          }
          t1glyph->control_data = _auStack_c58;
          t1glyph->control_len = (long)(int)glyph_data.pointer;
        }
      }
    }
  }
  else {
    decoder.cf2_instance.finalizer._4_4_ = 6;
  }
  if ((bVar3) &&
     (pFStack_bf8->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) {
    (*pFStack_bf8->internal->incremental_interface->funcs->free_glyph_data)
              (pFStack_bf8->internal->incremental_interface->object,(FT_Data *)auStack_c58);
    t1glyph->control_data = (void *)0x0;
    t1glyph->control_len = 0;
  }
  if (bVar4) {
    (*(code *)puVar2[1])(&face);
  }
  return decoder.cf2_instance.finalizer._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Load_Glyph( FT_GlyphSlot  t1glyph,          /* T1_GlyphSlot */
                 FT_Size       t1size,           /* T1_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    T1_GlyphSlot            glyph = (T1_GlyphSlot)t1glyph;
    FT_Error                error;
    T1_DecoderRec           decoder;
    T1_Face                 face = (T1_Face)t1glyph->face;
    FT_Bool                 hinting;
    FT_Bool                 scaled;
    FT_Bool                 force_scaling = FALSE;
    T1_Font                 type1         = &face->type1;
    PSAux_Service           psaux         = (PSAux_Service)face->psaux;
    const T1_Decoder_Funcs  decoder_funcs = psaux->t1_decoder_funcs;

    FT_Matrix               font_matrix;
    FT_Vector               font_offset;
    FT_Data                 glyph_data;
    FT_Bool                 must_finish_decoder = FALSE;
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Bool                 glyph_data_loaded = 0;
#endif


#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->root.num_glyphs &&
         !face->root.internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "T1_Load_Glyph: glyph index %d\n", glyph_index ));

    FT_ASSERT( ( face->len_buildchar == 0 ) == ( face->buildchar == NULL ) );

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    if ( t1size )
    {
      glyph->x_scale = t1size->metrics.x_scale;
      glyph->y_scale = t1size->metrics.y_scale;
    }
    else
    {
      glyph->x_scale = 0x10000L;
      glyph->y_scale = 0x10000L;
    }

    t1glyph->outline.n_points   = 0;
    t1glyph->outline.n_contours = 0;

    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 &&
                       ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint     = hinting;
    glyph->scaled   = scaled;
    t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;

    error = decoder_funcs->init( &decoder,
                                 t1glyph->face,
                                 t1size,
                                 t1glyph,
                                 (FT_Byte**)type1->glyph_names,
                                 face->blend,
                                 FT_BOOL( hinting ),
                                 FT_LOAD_TARGET_MODE( load_flags ),
                                 T1_Parse_Glyph );
    if ( error )
      goto Exit;

    must_finish_decoder = TRUE;

    decoder.builder.no_recurse = FT_BOOL(
                                   ( load_flags & FT_LOAD_NO_RECURSE ) != 0 );

    decoder.num_subrs     = type1->num_subrs;
    decoder.subrs         = type1->subrs;
    decoder.subrs_len     = type1->subrs_len;
    decoder.subrs_hash    = type1->subrs_hash;

    decoder.buildchar     = face->buildchar;
    decoder.len_buildchar = face->len_buildchar;

    /* now load the unscaled outline */
    error = T1_Parse_Glyph_And_Get_Char_String( &decoder, glyph_index,
                                                &glyph_data,
                                                &force_scaling );
    if ( error )
      goto Exit;
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    glyph_data_loaded = 1;
#endif

    hinting     = glyph->hint;
    font_matrix = decoder.font_matrix;
    font_offset = decoder.font_offset;

    /* save new glyph tables */
    decoder_funcs->done( &decoder );

    must_finish_decoder = FALSE;

    /* now, set the metrics -- this is rather simple, as   */
    /* the left side bearing is the xMin, and the top side */
    /* bearing the yMax                                    */
    if ( !error )
    {
      t1glyph->outline.flags &= FT_OUTLINE_OWNER;
      t1glyph->outline.flags |= FT_OUTLINE_REVERSE_FILL;

      /* for composite glyphs, return only left side bearing and */
      /* advance width                                           */
      if ( load_flags & FT_LOAD_NO_RECURSE )
      {
        FT_Slot_Internal  internal = t1glyph->internal;


        t1glyph->metrics.horiBearingX =
          FIXED_TO_INT( decoder.builder.left_bearing.x );
        t1glyph->metrics.horiAdvance  =
          FIXED_TO_INT( decoder.builder.advance.x );

        internal->glyph_matrix      = font_matrix;
        internal->glyph_delta       = font_offset;
        internal->glyph_transformed = 1;
      }
      else
      {
        FT_BBox            cbox;
        FT_Glyph_Metrics*  metrics = &t1glyph->metrics;


        /* copy the _unscaled_ advance width */
        metrics->horiAdvance =
          FIXED_TO_INT( decoder.builder.advance.x );
        t1glyph->linearHoriAdvance =
          FIXED_TO_INT( decoder.builder.advance.x );
        t1glyph->internal->glyph_transformed = 0;

        if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
        {
          /* make up vertical ones */
          metrics->vertAdvance = ( face->type1.font_bbox.yMax -
                                   face->type1.font_bbox.yMin ) >> 16;
          t1glyph->linearVertAdvance = metrics->vertAdvance;
        }
        else
        {
          metrics->vertAdvance =
            FIXED_TO_INT( decoder.builder.advance.y );
          t1glyph->linearVertAdvance =
            FIXED_TO_INT( decoder.builder.advance.y );
        }

        t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;

        if ( t1size && t1size->metrics.y_ppem < 24 )
          t1glyph->outline.flags |= FT_OUTLINE_HIGH_PRECISION;

#if 1
        /* apply the font matrix, if any */
        if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
             font_matrix.xy != 0        || font_matrix.yx != 0        )
        {
          FT_Outline_Transform( &t1glyph->outline, &font_matrix );

          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                            font_matrix.xx );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                            font_matrix.yy );
        }

        if ( font_offset.x || font_offset.y )
        {
          FT_Outline_Translate( &t1glyph->outline,
                                font_offset.x,
                                font_offset.y );

          metrics->horiAdvance += font_offset.x;
          metrics->vertAdvance += font_offset.y;
        }
#endif

        if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || force_scaling )
        {
          /* scale the outline and the metrics */
          FT_Int       n;
          FT_Outline*  cur = decoder.builder.base;
          FT_Vector*   vec = cur->points;
          FT_Fixed     x_scale = glyph->x_scale;
          FT_Fixed     y_scale = glyph->y_scale;


          /* First of all, scale the points, if we are not hinting */
          if ( !hinting || ! decoder.builder.hints_funcs )
            for ( n = cur->n_points; n > 0; n--, vec++ )
            {
              vec->x = FT_MulFix( vec->x, x_scale );
              vec->y = FT_MulFix( vec->y, y_scale );
            }

          /* Then scale the metrics */
          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
        }

        /* compute the other metrics */
        FT_Outline_Get_CBox( &t1glyph->outline, &cbox );

        metrics->width  = cbox.xMax - cbox.xMin;
        metrics->height = cbox.yMax - cbox.yMin;

        metrics->horiBearingX = cbox.xMin;
        metrics->horiBearingY = cbox.yMax;

        if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
        {
          /* make up vertical ones */
          ft_synthesize_vertical_metrics( metrics,
                                          metrics->vertAdvance );
        }
      }

      /* Set control data to the glyph charstrings.  Note that this is */
      /* _not_ zero-terminated.                                        */
      t1glyph->control_data = (FT_Byte*)glyph_data.pointer;
      t1glyph->control_len  = glyph_data.length;
    }


  Exit:

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_data_loaded && face->root.internal->incremental_interface )
    {
      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object,
        &glyph_data );

      /* Set the control data to null - it is no longer available if   */
      /* loaded incrementally.                                         */
      t1glyph->control_data = NULL;
      t1glyph->control_len  = 0;
    }
#endif

    if ( must_finish_decoder )
      decoder_funcs->done( &decoder );

    return error;
  }